

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void __thiscall
peach::exception::PositionalError::PositionalError
          (PositionalError *this,size_t line,size_t position,string *exceptionClass,string *comment)

{
  size_type *psVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  char cVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_t sVar9;
  char cVar10;
  ulong uVar11;
  string __str_1;
  string __str;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  uint local_d0;
  undefined4 uStack_cc;
  ulong local_c8 [2];
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string local_78;
  ulong *local_58;
  long local_50;
  ulong local_48;
  long lStack_40;
  string *local_38;
  
  pcVar3 = (comment->_M_dataplus)._M_p;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + comment->_M_string_length);
  std::__cxx11::string::append((char *)&local_f8);
  cVar10 = '\x01';
  if (9 < line) {
    sVar9 = line;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (sVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0012497b;
      }
      if (sVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0012497b;
      }
      if (sVar9 < 10000) goto LAB_0012497b;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar4);
    cVar10 = cVar10 + '\x01';
  }
LAB_0012497b:
  local_b8 = local_a8;
  local_38 = exceptionClass;
  std::__cxx11::string::_M_construct((ulong)&local_b8,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,line);
  uVar2 = CONCAT44(uStack_ac,local_b0) + local_f0;
  uVar11 = 0xf;
  if (local_f8 != local_e8) {
    uVar11 = local_e8[0];
  }
  if (uVar11 < uVar2) {
    uVar11 = 0xf;
    if (local_b8 != local_a8) {
      uVar11 = local_a8[0];
    }
    if (uVar11 < uVar2) goto LAB_001249e7;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_001249e7:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b8);
  }
  local_98 = &local_88;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_88 = *plVar7;
    uStack_80 = puVar6[3];
  }
  else {
    local_88 = *plVar7;
    local_98 = (long *)*puVar6;
  }
  local_90 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_48 = *puVar8;
    lStack_40 = plVar7[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *puVar8;
    local_58 = (ulong *)*plVar7;
  }
  local_50 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar10 = '\x01';
  if (9 < position) {
    sVar9 = position;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (sVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00124b0a;
      }
      if (sVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00124b0a;
      }
      if (sVar9 < 10000) goto LAB_00124b0a;
      bVar4 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar4);
    cVar10 = cVar10 + '\x01';
  }
LAB_00124b0a:
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct((ulong)&local_d8,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,local_d0,position);
  uVar2 = CONCAT44(uStack_cc,local_d0) + local_50;
  uVar11 = 0xf;
  if (local_58 != &local_48) {
    uVar11 = local_48;
  }
  if (uVar11 < uVar2) {
    uVar11 = 0xf;
    if (local_d8 != local_c8) {
      uVar11 = local_c8[0];
    }
    if (uVar2 <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_58);
      goto LAB_00124b9a;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_d8);
LAB_00124b9a:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_78.field_2._M_allocated_capacity = *psVar1;
    local_78.field_2._8_8_ = puVar6[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar1;
    local_78._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_78._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  PeachException::PeachException(&this->super_PeachException,local_38,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  *(undefined ***)&this->super_PeachException = &PTR__PeachException_00132628;
  this->line_ = line;
  this->position_ = position;
  return;
}

Assistant:

PositionalError(std::size_t line,
                    std::size_t position,
                    const std::string &exceptionClass,
                    const std::string &comment)
        : PeachException(exceptionClass,
                         comment + " at " +
                             std::to_string(line) +
                             ":" + std::to_string(position)),
          line_(line),
          position_(position)
    {
    }